

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,bool clean,bool fast,
          bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppGVar2;
  cmake *this_00;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  int iVar8;
  pointer *r;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int retVal;
  string makeCommandStr;
  allocator_type local_101;
  string outputBuffer;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  cmWorkingDirectory workdir;
  
  bVar4 = cmSystemTools::s_RunCommandHideConsole;
  local_a8._16_8_ = timeout.__r;
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  std::__cxx11::string::append((char *)output);
  std::__cxx11::string::_M_append((char *)output,(ulong)(bindir->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)output);
  paVar1 = &outputBuffer.field_2;
  outputBuffer._M_dataplus._M_p = (pointer)paVar1;
  if (workdir.ResultCode != 0) {
    cmSystemTools::s_RunCommandHideConsole = bVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&outputBuffer,"Failed to change directory: ","");
    strerror(workdir.ResultCode);
    std::__cxx11::string::append((char *)&outputBuffer);
    cmSystemTools::Error(&outputBuffer);
    std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
    std::__cxx11::string::append((char *)output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputBuffer._M_dataplus._M_p != paVar1) {
      operator_delete(outputBuffer._M_dataplus._M_p,
                      CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                               outputBuffer.field_2._M_local_buf[0]) + 1);
    }
    iVar8 = 1;
    goto LAB_002b5c94;
  }
  retVal = 0;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer._M_string_length = 0;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  (*this->_vptr_cmGlobalGenerator[0x11])
            (&makeCommand,this,makeCommandCSTR,projectName,bindir,targets,config,(ulong)fast,
             (ulong)(uint)jobs,(ulong)verbose,nativeOptions);
  if (outputflag == OUTPUT_PASSTHROUGH) {
    outputflag = makeCommand.
                 super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].super_GeneratedMakeCommand.
                 RequiresOutputForward ^ OUTPUT_PASSTHROUGH;
  }
  makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
  if (clean) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&makeCommandStr,"clean","");
    __l._M_len = 1;
    __l._M_array = &makeCommandStr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,__l,&local_101);
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*this->_vptr_cmGlobalGenerator[0x11])
              (&cleanCommand,this,makeCommandCSTR,projectName,bindir,local_b8,config,(ulong)fast,
               (ulong)(uint)jobs,(ulong)verbose,&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
    paVar1 = &makeCommandStr.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != paVar1) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)output);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&makeCommandStr,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)cleanCommand.
                  super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                  ._M_impl.super__Vector_impl_data._M_start," ");
    std::__cxx11::string::_M_append((char *)output,(ulong)makeCommandStr._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != paVar1) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::append((char *)output);
    if ((long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      bVar3 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,&outputBuffer,&outputBuffer,
                         &retVal,(char *)0x0,outputflag,(cmDuration)local_a8._16_8_,Auto);
      if (bVar3) {
        std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
        std::
        vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ::~vector(&cleanCommand);
        goto LAB_002b588d;
      }
      cmSystemTools::s_RunCommandHideConsole = bVar4;
      makeCommandStr._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&makeCommandStr,"Generator: execution of make clean failed.","");
      cmSystemTools::Error(&makeCommandStr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)makeCommandStr._M_dataplus._M_p != paVar1) {
        operator_delete(makeCommandStr._M_dataplus._M_p,
                        CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                                 makeCommandStr.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
      std::__cxx11::string::append((char *)output);
    }
    else {
      this_00 = this->CMakeInstance;
      makeCommandStr._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&makeCommandStr,
                 "The generator did not produce exactly one command for the \'clean\' target","");
      local_b8._0_8_ = (element_type *)0x0;
      local_b8._8_8_ = (pointer)0x0;
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&makeCommandStr,(cmListFileBacktrace *)local_b8);
      if ((pointer)local_b8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)makeCommandStr._M_dataplus._M_p != paVar1) {
        operator_delete(makeCommandStr._M_dataplus._M_p,
                        CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                                 makeCommandStr.field_2._M_local_buf[0]) + 1);
      }
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector(&cleanCommand);
    iVar8 = 1;
  }
  else {
LAB_002b588d:
    makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
    makeCommandStr._M_string_length = 0;
    makeCommandStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)output);
    if (makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        makeCommand.
        super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      r = (pointer *)
          makeCommand.
          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)&cleanCommand,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)r," ");
        std::__cxx11::string::operator=((string *)&makeCommandStr,(string *)&cleanCommand);
        if (cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&cleanCommand.
                      super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(cleanCommand.
                          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&((cleanCommand.
                                           super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         super_GeneratedMakeCommand).PrimaryCommand.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((pointer)r !=
            makeCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::append((char *)&makeCommandStr);
        }
        std::__cxx11::string::_M_append((char *)output,(ulong)makeCommandStr._M_dataplus._M_p);
        bVar3 = cmSystemTools::RunSingleCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)r,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,outputflag,
                           (cmDuration)local_a8._16_8_,Auto);
        if (!bVar3) {
          cmSystemTools::s_RunCommandHideConsole = bVar4;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &cleanCommand,"Generator: execution of make failed. Make command was: ",
                         &makeCommandStr);
          ppGVar2 = &cleanCommand.
                     super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cmSystemTools::Error((string *)&cleanCommand);
          if (cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppGVar2) {
            operator_delete(cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((cleanCommand.
                                             super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super_GeneratedMakeCommand).PrimaryCommand.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b8,"\nGenerator: execution of make failed. Make command was: ",
                         &makeCommandStr);
          plVar6 = (long *)std::__cxx11::string::append(local_b8);
          plVar7 = plVar6 + 2;
          if ((pointer *)*plVar6 == (pointer *)plVar7) {
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)ppGVar2;
          }
          else {
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
            cleanCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar6;
          }
          cleanCommand.
          super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar6[1];
          *plVar6 = (long)plVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)output,
                     (ulong)cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          if (cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppGVar2) {
            operator_delete(cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((cleanCommand.
                                             super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           super_GeneratedMakeCommand).PrimaryCommand.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 1));
          }
          if ((element_type *)local_b8._0_8_ != (element_type *)local_a8) {
            operator_delete((void *)local_b8._0_8_,
                            (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                       *)local_a8._0_8_)->_M_t)._M_impl.field_0x1);
          }
          goto LAB_002b5c54;
        }
        std::__cxx11::string::_M_append((char *)output,(ulong)outputBuffer._M_dataplus._M_p);
        r = r + 4;
      } while ((pointer)r !=
               makeCommand.
               super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::string::append((char *)output);
    cmSystemTools::s_RunCommandHideConsole = bVar4;
    bVar4 = cmState::UseWatcomWMake
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    iVar8 = retVal;
    if ((bVar4 && retVal == 0) &&
       (lVar5 = std::__cxx11::string::find((char *)output,0x501bcc,0), iVar8 = retVal, lVar5 != -1))
    {
      retVal = 1;
LAB_002b5c54:
      iVar8 = 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)makeCommandStr._M_dataplus._M_p != &makeCommandStr.field_2) {
      operator_delete(makeCommandStr._M_dataplus._M_p,
                      CONCAT71(makeCommandStr.field_2._M_allocated_capacity._1_7_,
                               makeCommandStr.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector(&makeCommand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputBuffer._M_dataplus._M_p != &outputBuffer.field_2) {
    operator_delete(outputBuffer._M_dataplus._M_p,
                    CONCAT71(outputBuffer.field_2._M_allocated_capacity._1_7_,
                             outputBuffer.field_2._M_local_buf[0]) + 1);
  }
LAB_002b5c94:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar8;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, bool clean, bool fast, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = "Failed to change directory: ";
    err += std::strerror(workdir.GetLastResult());
    cmSystemTools::Error(err);
    output += err;
    output += "\n";
    return 1;
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand =
    this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir, targets,
                               config, fast, jobs, verbose, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, config, fast, jobs, verbose);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  for (auto command = makeCommand.begin(); command != makeCommand.end();
       ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}